

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckOfBuildinigUnitTiles.cpp
# Opt level: O0

void __thiscall
DeckOfBuildingUnitTiles::flipTile(DeckOfBuildingUnitTiles *this,BuildingUnitTiles *tile)

{
  Units UVar1;
  int iVar2;
  BuildingUnitTiles *tile_local;
  DeckOfBuildingUnitTiles *this_local;
  
  UVar1 = BuildingUnitTiles::getUnit(tile);
  if (UVar1 == Infantry) {
    BuildingUnitTiles::setRewardType(tile,Heart);
  }
  else if (UVar1 == Jet) {
    BuildingUnitTiles::setRewardType(tile,Energy);
  }
  else if (UVar1 == Tank) {
    BuildingUnitTiles::setRewardType(tile,Star);
  }
  iVar2 = BuildingUnitTiles::getDurability(tile);
  BuildingUnitTiles::setDurability(tile,iVar2 + 1);
  BuildingUnitTiles::setIsUnit(tile,true);
  return;
}

Assistant:

void DeckOfBuildingUnitTiles::flipTile(BuildingUnitTiles *tile) {
    switch (tile->getUnit()) {
        case BuildingUnitTiles::Infantry: tile->setRewardType(BuildingUnitTiles::Heart); break;
        case BuildingUnitTiles::Jet: tile->setRewardType(BuildingUnitTiles::Energy); break;
        case BuildingUnitTiles::Tank: tile->setRewardType(BuildingUnitTiles::Star); break;
    }

    tile->setDurability(tile->getDurability()+1);
    tile->setIsUnit(true);
}